

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

void __thiscall ncnn::Convolution::~Convolution(Convolution *this)

{
  void *in_RDI;
  Convolution *unaff_retaddr;
  
  ~Convolution(unaff_retaddr);
  operator_delete(in_RDI,0x140);
  return;
}

Assistant:

Convolution::~Convolution()
{
    delete quantize;
    delete dequantize;
}